

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkState.cpp
# Opt level: O1

string * __thiscall
iDynTree::LinkPositions::toString_abi_cxx11_
          (string *__return_storage_ptr__,LinkPositions *this,Model *model)

{
  string *psVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  stringstream ss;
  long *local_208;
  long local_200;
  long local_1f8 [2];
  string local_1e8;
  string *local_1c8;
  Model *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8 = __return_storage_ptr__;
  local_1c0 = model;
  std::__cxx11::stringstream::stringstream(local_1b8);
  lVar2 = (long)(this->m_linkPos).
                super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_linkPos).
                super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar2 != 0) {
    lVar4 = (lVar2 >> 5) * -0x5555555555555555;
    lVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Position for link ",0x12);
      Model::getLinkName_abi_cxx11_(&local_1e8,local_1c0,lVar2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      iDynTree::Transform::toString_abi_cxx11_();
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)local_208,local_200);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_208 != local_1f8) {
        operator_delete(local_208,local_1f8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      lVar2 = lVar2 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar2);
  }
  psVar1 = local_1c8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string LinkPositions::toString(const Model& model) const
{
   std::stringstream ss;

    size_t nrOfLinks = this->getNrOfLinks();
    for(size_t l=0; l < nrOfLinks; l++)
    {
        ss << "Position for link " << model.getLinkName(l) << ":" << this->operator()(l).toString() << std::endl;
    }
    return ss.str();
}